

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_free_node(art_node_t *node)

{
  _Bool _Var1;
  byte bVar2;
  art_node256_t *node_00;
  art_inner_node_t *in_RDI;
  
  _Var1 = art_is_leaf((art_node_t *)in_RDI);
  if (!_Var1) {
    bVar2 = art_get_type(in_RDI);
    node_00 = (art_node256_t *)(ulong)bVar2;
    switch(node_00) {
    case (art_node256_t *)0x0:
      art_free_node4((art_node4_t *)node_00);
      break;
    case (art_node256_t *)0x1:
      art_free_node16((art_node16_t *)node_00);
      break;
    case (art_node256_t *)0x2:
      art_free_node48((art_node48_t *)node_00);
      break;
    case (art_node256_t *)0x3:
      art_free_node256(node_00);
    }
  }
  return;
}

Assistant:

static void art_free_node(art_node_t *node) {
    if (art_is_leaf(node)) {
        // We leave it up to the user to free leaves.
        return;
    }
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE:
            art_free_node4((art_node4_t *)node);
            break;
        case ART_NODE16_TYPE:
            art_free_node16((art_node16_t *)node);
            break;
        case ART_NODE48_TYPE:
            art_free_node48((art_node48_t *)node);
            break;
        case ART_NODE256_TYPE:
            art_free_node256((art_node256_t *)node);
            break;
        default:
            assert(false);
    }
}